

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimations(OgreXmlSerializer *this,Skeleton *skeleton)

{
  bool bVar1;
  Logger *pLVar2;
  Animation *this_00;
  string *__lhs;
  DeadlyImportError *pDVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  float fVar6;
  size_type local_3b8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_238;
  undefined1 local_211;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_98;
  string local_78;
  Animation *local_58;
  Animation *anim;
  allocator<char> local_39;
  string local_38;
  Skeleton *local_18;
  Skeleton *skeleton_local;
  OgreXmlSerializer *this_local;
  
  local_18 = skeleton;
  skeleton_local = (Skeleton *)this;
  bVar1 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::empty
                    (&skeleton->bones);
  if (bVar1) {
    anim._3_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Cannot read <animations> for a Skeleton without bones",&local_39
              );
    DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
    anim._3_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"  - Animations");
  NextNode_abi_cxx11_(this);
  while( true ) {
    bVar1 = std::operator==(&this->m_currentNodeName,nnAnimation);
    if (!bVar1) {
      return;
    }
    this_00 = (Animation *)operator_new(0x70);
    Ogre::Animation::Animation(this_00,local_18);
    local_58 = this_00;
    ReadAttribute<std::__cxx11::string>(&local_78,this,"name");
    std::__cxx11::string::operator=((string *)&local_58->name,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    fVar6 = ReadAttribute<float>(this,"length");
    local_58->length = fVar6;
    __lhs = NextNode_abi_cxx11_(this);
    bVar1 = std::operator!=(__lhs,nnTracks);
    if (bVar1) break;
    ReadAnimationTracks(this,local_58);
    std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::push_back
              (&local_18->animations,&local_58);
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>(&local_3b0,(char (*) [5])"    ");
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_3b0,&local_58->name);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,(char (*) [3])0xb5c0ff);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,&local_58->length);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,(char (*) [7])" sec, ");
    local_3b8 = std::
                vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
                ::size(&local_58->tracks);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,&local_3b8);
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,(char (*) [9])" tracks)");
    Formatter::basic_formatter::operator_cast_to_string(&local_238,pbVar5);
    Logger::debug(pLVar2,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_3b0);
  }
  local_211 = 1;
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_210);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_210,(char (*) [34])"No <tracks> found in <animation> ");
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,&local_58->name);
  Formatter::basic_formatter::operator_cast_to_string(&local_98,pbVar5);
  DeadlyImportError::DeadlyImportError(pDVar3,&local_98);
  local_211 = 0;
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreXmlSerializer::ReadAnimations(Skeleton *skeleton)
{
    if (skeleton->bones.empty()) {
        throw DeadlyImportError("Cannot read <animations> for a Skeleton without bones");
    }

    ASSIMP_LOG_DEBUG("  - Animations");

    NextNode();
    while(m_currentNodeName == nnAnimation)
    {
        Animation *anim = new Animation(skeleton);
        anim->name = ReadAttribute<std::string>("name");
        anim->length = ReadAttribute<float>("length");

        if (NextNode() != nnTracks) {
            throw DeadlyImportError(Formatter::format() << "No <tracks> found in <animation> " << anim->name);
        }

        ReadAnimationTracks(anim);
        skeleton->animations.push_back(anim);

        ASSIMP_LOG_DEBUG_F( "    ", anim->name, " (", anim->length, " sec, ", anim->tracks.size(), " tracks)");
    }
}